

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAcurv.cpp
# Opt level: O3

void __thiscall chrono::fea::ChNodeFEAcurv::NodeIntStateScatter(ChNodeFEAcurv *this)

{
  uint in_ECX;
  ChState *in_RDX;
  uint in_ESI;
  ChStateDelta *in_R8;
  double in_XMM0_Qa;
  
  NodeIntStateScatter((ChNodeFEAcurv *)
                      ((long)(this->m_ryy).m_data +
                      (long)((this->super_ChNodeFEAbase)._vptr_ChNodeFEAbase[-7] + -0x38)),in_ESI,
                      in_RDX,in_ECX,in_R8,in_XMM0_Qa);
  return;
}

Assistant:

void ChNodeFEAcurv::NodeIntStateScatter(const unsigned int off_x,
                                        const ChState& x,
                                        const unsigned int off_v,
                                        const ChStateDelta& v,
                                        const double T) {
    m_rxx = x.segment(off_x + 0, 3);
    m_ryy = x.segment(off_x + 3, 3);
    m_rzz = x.segment(off_x + 6, 3);

    m_rxx_dt = v.segment(off_v + 0, 3);
    m_ryy_dt = v.segment(off_v + 3, 3);
    m_rzz_dt = v.segment(off_v + 6, 3);
}